

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

int __thiscall
CVmObjFileName::getp_createDirectory
          (CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  err_frame_t *peVar1;
  CVmException *pCVar2;
  int iVar3;
  CVmNetFile *this_00;
  undefined8 *puVar4;
  long *plVar5;
  __mode_t __mode;
  uint uVar6;
  char *__path;
  err_frame_t err_cur__;
  vm_rcdesc rc;
  
  if (oargc == (uint *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *oargc;
  }
  if (getp_createDirectory(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar3 = __cxa_guard_acquire(&getp_createDirectory(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar3 != 0) {
      getp_createDirectory::desc.min_argc_ = 0;
      getp_createDirectory::desc.opt_argc_ = 1;
      getp_createDirectory::desc.varargs_ = 0;
      __cxa_guard_release(&getp_createDirectory(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,oargc,&getp_createDirectory::desc);
  if (iVar3 == 0) {
    CVmMetaclass::get_class_obj(metaclass_reg_);
    vm_rcdesc::init(&rc,(EVP_PKEY_CTX *)"FileName.createDirectory");
    this_00 = CVmObjFile::get_filename_from_obj(self,&rc,0x1002,0xb,"application/octet-stream");
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    err_cur__.prv_ = (err_frame_t *)*puVar4;
    plVar5 = (long *)_ZTW11G_err_frame();
    *plVar5 = (long)&err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    if (err_cur__.state_ == 0) {
      if (uVar6 == 0) {
        __path = (char *)0x0;
      }
      else {
        if (sp_[-1].typ - VM_STACK < 0xfffffffe) {
          err_throw(0x900);
        }
        __path = (char *)(ulong)(sp_[-1].typ == VM_TRUE);
      }
      CVmNetFile::mkdir(this_00,__path,__mode);
    }
    if (-1 < (short)err_cur__.state_) {
      err_cur__.state_ = err_cur__.state_ | 0x8000;
      CVmNetFile::abandon(this_00);
    }
    peVar1 = err_cur__.prv_;
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    *puVar4 = peVar1;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      puVar4 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar4 & 2) != 0) {
        plVar5 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar5 + 0x10));
      }
      pCVar2 = err_cur__.exc_;
      plVar5 = (long *)_ZTW11G_err_frame();
      *(CVmException **)(*plVar5 + 0x10) = pCVar2;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    sp_ = sp_ + -(long)(int)uVar6;
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_createDirectory(VMG_ vm_obj_id_t self,
                                         vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the filename; use MKDIR access mode */
    vm_rcdesc rc(vmg_ "FileName.createDirectory",
                 metaclass_reg_->get_class_obj(vmg0_),
                 VMOFN_CREATEDIR, G_stk->get(0), argc);
    CVmNetFile *netfile = CVmObjFile::get_filename_from_obj(
        vmg_ self, &rc, VMOBJFILE_ACCESS_MKDIR,
        OSFTUNK, "application/octet-stream");

    err_try
    {
        /* get the "create parents" parameter */
        int create_parents = FALSE;
        if (argc >= 1)
        {
            /* check that it's a true/nil value */
            if (!G_stk->get(0)->is_logical())
                err_throw(VMERR_BAD_TYPE_BIF);

            /* retrieve the flag */
            create_parents = G_stk->get(0)->get_logical();
        }

        /* create the directory */
        netfile->mkdir(vmg_ create_parents);
    }